

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaeValidator.cpp
# Opt level: O2

int __thiscall opencollada::DaeValidator::checkLinks(DaeValidator *this,Dae *dae)

{
  Uri *uri;
  key_type *pkVar1;
  bool bVar2;
  ostream *poVar3;
  string *psVar4;
  const_iterator cVar5;
  const_iterator cVar6;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  iterator iVar7;
  tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *IDREF;
  Uri *this_00;
  key_type *__k;
  int iVar8;
  allocator local_159;
  _Base_ptr local_158;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_150;
  Dae *local_148;
  _Base_ptr local_140;
  map<opencollada::Uri,_opencollada::Dae,_std::less<opencollada::Uri>,_std::allocator<std::pair<const_opencollada::Uri,_opencollada::Dae>_>_>
  *local_138;
  Uri *local_130;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ext_ids;
  Uri no_fragment_uri;
  
  poVar3 = ::std::operator<<((ostream *)&::std::cout,"Checking links...");
  ::std::endl<char,std::char_traits<char>>(poVar3);
  local_150 = &Dae::getIds_abi_cxx11_(dae)->_M_t;
  local_130 = (Uri *)(dae->mAnyURIs).
                     super__Vector_base<std::tuple<unsigned_long,_opencollada::Uri>,_std::allocator<std::tuple<unsigned_long,_opencollada::Uri>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
  uri = &dae->mUri;
  local_138 = &dae->mExternalDAEs;
  local_140 = &(dae->mExternalDAEs)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_158 = &(((_Rep_type *)&local_150->_M_impl)->_M_impl).super__Rb_tree_header._M_header;
  iVar8 = 0;
  local_148 = dae;
  for (this_00 = (Uri *)(dae->mAnyURIs).
                        super__Vector_base<std::tuple<unsigned_long,_opencollada::Uri>,_std::allocator<std::tuple<unsigned_long,_opencollada::Uri>_>_>
                        ._M_impl.super__Vector_impl_data._M_start; this_00 != local_130;
      this_00 = (Uri *)&this_00[1].mUri._M_string_length) {
    Uri::nativePath_abi_cxx11_(&no_fragment_uri.mUri,this_00);
    bVar2 = Path::Exists(&no_fragment_uri.mUri);
    ::std::__cxx11::string::~string((string *)&no_fragment_uri);
    if (bVar2) {
      psVar4 = Uri::fragment_abi_cxx11_(this_00);
      if (psVar4->_M_string_length != 0) {
        Uri::Uri(&no_fragment_uri,this_00);
        ::std::__cxx11::string::string((string *)&ext_ids,"",&local_159);
        Uri::setFragment(&no_fragment_uri,(string *)&ext_ids);
        ::std::__cxx11::string::~string((string *)&ext_ids);
        bVar2 = Uri::operator==(&no_fragment_uri,uri);
        if (bVar2) {
          psVar4 = Uri::fragment_abi_cxx11_(this_00);
          cVar5 = ::std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find(local_150,psVar4);
          if (cVar5._M_node == local_158) {
            poVar3 = operator<<((ostream *)&::std::cerr,uri);
            poVar3 = ::std::operator<<(poVar3,":");
            poVar3 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
            poVar3 = ::std::operator<<(poVar3,": Can\'t resolve #");
            psVar4 = Uri::fragment_abi_cxx11_(this_00);
            poVar3 = ::std::operator<<(poVar3,(string *)psVar4);
            ::std::endl<char,std::char_traits<char>>(poVar3);
            iVar8 = 1;
          }
        }
        else {
          cVar6 = ::std::
                  _Rb_tree<opencollada::Uri,_std::pair<const_opencollada::Uri,_opencollada::Dae>,_std::_Select1st<std::pair<const_opencollada::Uri,_opencollada::Dae>_>,_std::less<opencollada::Uri>,_std::allocator<std::pair<const_opencollada::Uri,_opencollada::Dae>_>_>
                  ::find(&local_138->_M_t,&no_fragment_uri);
          if (cVar6._M_node != local_140) {
            bVar2 = XmlDoc::operator_cast_to_bool((XmlDoc *)&cVar6._M_node[7]._M_parent);
            if (bVar2) {
              __x = &Dae::getIds_abi_cxx11_((Dae *)&cVar6._M_node[7]._M_parent)->_M_t;
              ::std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&ext_ids,__x);
              psVar4 = Uri::fragment_abi_cxx11_(this_00);
              iVar7 = ::std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&ext_ids,psVar4);
              if ((_Rb_tree_header *)iVar7._M_node == &ext_ids._M_t._M_impl.super__Rb_tree_header) {
                poVar3 = operator<<((ostream *)&::std::cerr,uri);
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
                poVar3 = ::std::operator<<(poVar3,": Can\'t resolve ");
                poVar3 = operator<<(poVar3,this_00);
                ::std::endl<char,std::char_traits<char>>(poVar3);
                iVar8 = 1;
              }
              ::std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&ext_ids);
            }
            else {
              poVar3 = operator<<((ostream *)&::std::cerr,uri);
              poVar3 = ::std::operator<<(poVar3,":");
              poVar3 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
              poVar3 = ::std::operator<<(poVar3,": ");
              poVar3 = operator<<(poVar3,this_00);
              poVar3 = ::std::operator<<(poVar3,
                                         ": referenced file exists but has not been successfully loaded."
                                        );
              ::std::endl<char,std::char_traits<char>>(poVar3);
              iVar8 = 1;
            }
          }
        }
        Uri::~Uri(&no_fragment_uri);
      }
    }
    else {
      poVar3 = operator<<((ostream *)&::std::cerr,uri);
      poVar3 = ::std::operator<<(poVar3,":");
      poVar3 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = ::std::operator<<(poVar3,": Can\'t resolve ");
      poVar3 = operator<<(poVar3,this_00);
      ::std::endl<char,std::char_traits<char>>(poVar3);
      iVar8 = 1;
    }
  }
  pkVar1 = (key_type *)
           (local_148->mIDREFs).
           super__Vector_base<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__k = (key_type *)
             (local_148->mIDREFs).
             super__Vector_base<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start; __k != pkVar1;
      __k = (key_type *)&__k[1]._M_string_length) {
    cVar5 = ::std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(local_150,__k);
    if (cVar5._M_node == local_158) {
      poVar3 = operator<<((ostream *)&::std::cerr,uri);
      poVar3 = ::std::operator<<(poVar3,":");
      poVar3 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = ::std::operator<<(poVar3,": Can\'t resolve #");
      poVar3 = ::std::operator<<(poVar3,(string *)__k);
      ::std::endl<char,std::char_traits<char>>(poVar3);
      iVar8 = 1;
    }
  }
  return iVar8;
}

Assistant:

int DaeValidator::checkLinks(const Dae & dae) const
	{
		cout << "Checking links..." << endl;

		const auto & ids = dae.getIds();

		int result = 0;
		for (const auto & t : dae.getAnyURIs())
		{
			const auto & line = get<0>(t);
			const auto & uri = get<1>(t);
			if (!Path::Exists(uri.nativePath()))
			{
				cerr << dae.getURI() << ":" << line << ": Can't resolve " << uri << endl;
				result |= 1;
			}
			else if (!uri.fragment().empty())
			{
				Uri no_fragment_uri(uri);
				no_fragment_uri.setFragment("");
				if (no_fragment_uri == dae.getURI())
				{
					auto id = ids.find(uri.fragment());
					if (id == ids.end())
					{
						cerr << dae.getURI() << ":" << line << ": Can't resolve #" << uri.fragment() << endl;
						result |= 1;
					}
				}
				else
				{
					auto it = dae.getExternalDAEs().find(no_fragment_uri);
					if (it != dae.getExternalDAEs().end())
					{
						if (it->second)
						{
							auto ext_ids = it->second.getIds();
							auto id = ext_ids.find(uri.fragment());
							if (id == ext_ids.end())
							{
								cerr << dae.getURI() << ":" << line << ": Can't resolve " << uri << endl;
								result |= 1;
							}
						}
						else
						{
							cerr << dae.getURI() << ":" << line << ": " << uri << ": referenced file exists but has not been successfully loaded." << endl;
							result |= 1;
						}
					}
				}
			}
		}

		// IDREF
		for (const auto & IDREF : dae.getIDREFs())
		{
			const auto & line = get<0>(IDREF);
			const auto & idref = get<1>(IDREF);

			auto id = ids.find(idref);
			if (id == ids.end())
			{
				cerr << dae.getURI() << ":" << line << ": Can't resolve #" << idref << endl;
				result |= 1;
			}
		}

		return result;
	}